

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_code.hpp
# Opt level: O1

string_ref *
system_error2::_posix_code_domain::_make_string_ref(string_ref *__return_storage_ptr__,int c)

{
  char *pcVar1;
  size_t len;
  char buffer [1024];
  string_ref sStack_458;
  char local_428 [1023];
  undefined1 local_29;
  
  memset(local_428,0,0x400);
  pcVar1 = strerror_r(c,local_428,0x400);
  if (pcVar1 != (char *)0x0) {
    strncpy(local_428,pcVar1,0x3ff);
    local_29 = 0;
  }
  len = strlen(local_428);
  pcVar1 = (char *)malloc(len + 1);
  if (pcVar1 == (char *)0x0) {
    __return_storage_ptr__->_begin = "failed to get message from system";
    __return_storage_ptr__->_end = "";
    __return_storage_ptr__->_state[0] = (void *)0x0;
    __return_storage_ptr__->_state[1] = (void *)0x0;
    __return_storage_ptr__->_state[2] = (void *)0x0;
    __return_storage_ptr__->_thunk = status_code_domain::string_ref::_checking_string_thunk;
  }
  else {
    memcpy(pcVar1,local_428,len + 1);
    status_code_domain::atomic_refcounted_string_ref::atomic_refcounted_string_ref
              ((atomic_refcounted_string_ref *)&sStack_458,pcVar1,len,(void *)0x0,(void *)0x0);
    status_code_domain::string_ref::string_ref(__return_storage_ptr__,&sStack_458);
    if (sStack_458._thunk != (_thunk_spec)0x0) {
      (*sStack_458._thunk)(&sStack_458,(string_ref *)0x0,destruct);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static _base::string_ref _make_string_ref(int c) noexcept
  {
    char buffer[1024] = "";
#ifdef _WIN32
    strerror_s(buffer, sizeof(buffer), c);
#elif defined(__GLIBC__) && !defined(__UCLIBC__)  // handle glibc's weird strerror_r()
    char *s = detail::avoid_string_include::strerror_r(c, buffer, sizeof(buffer));  // NOLINT
    if(s != nullptr)
    {
      strncpy(buffer, s, sizeof(buffer) - 1);  // NOLINT
      buffer[1023] = 0;
    }
#elif !defined(__APPLE__)
    detail::avoid_string_include::strerror_r(c, buffer, sizeof(buffer));
#else
    strerror_r(c, buffer, sizeof(buffer));
#endif
    size_t length = strlen(buffer);                     // NOLINT
    auto *p = static_cast<char *>(malloc(length + 1));  // NOLINT
    if(p == nullptr)
    {
      return _base::string_ref("failed to get message from system");
    }
    memcpy(p, buffer, length + 1);  // NOLINT
    return _base::atomic_refcounted_string_ref(p, length);
  }